

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O3

size_t Curl_bufq_len(bufq *q)

{
  size_t sVar1;
  buf_chunk *pbVar2;
  
  sVar1 = 0;
  for (pbVar2 = q->head; pbVar2 != (buf_chunk *)0x0; pbVar2 = pbVar2->next) {
    sVar1 = (sVar1 - pbVar2->r_offset) + pbVar2->w_offset;
  }
  return sVar1;
}

Assistant:

size_t Curl_bufq_len(const struct bufq *q)
{
  const struct buf_chunk *chunk = q->head;
  size_t len = 0;
  while(chunk) {
    len += chunk_len(chunk);
    chunk = chunk->next;
  }
  return len;
}